

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O2

void __thiscall
kj::anon_unknown_0::TestExceptionCallback::logMessage
          (TestExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  ProcessContext *pPVar1;
  size_t sVar2;
  Array<char> *params_1;
  char *pcVar3;
  String *params_3;
  ArrayPtr<void_*const> trace_00;
  ArrayPtr<void_*> space;
  undefined4 uStack_190;
  int line_local;
  Array<char> local_188;
  char *file_local;
  Array<char> local_168;
  Array<char> local_150;
  ArrayPtr<void_*const> trace;
  void *traceSpace [32];
  
  space.size_ = 2;
  space.ptr = (void **)0x20;
  line_local = line;
  file_local = file;
  trace = getStackTrace((kj *)traceSpace,space,line);
  if ((text->content).size_ < 2) {
    heapString((String *)&local_188,"expectation failed");
    Array<char>::operator=(&text->content,&local_188);
    Array<char>::~Array(&local_188);
  }
  local_150.size_ = (size_t)contextDepth;
  local_150.ptr._0_1_ = 0x5f;
  params_1 = &local_168;
  local_168.ptr._0_1_ = 0x3a;
  params_3 = (String *)0x57a04c;
  str<kj::Repeat<char>,char_const*&,char,int&,char_const(&)[3],kj::String>
            ((String *)&local_188,(kj *)&local_150,(Repeat<char> *)&file_local,&params_1->ptr,
             (char *)&line_local,(int *)0x57a04c,(char (*) [3])text,
             (String *)CONCAT44(line_local,uStack_190));
  Array<char>::operator=(&text->content,&local_188);
  Array<char>::~Array(&local_188);
  if ((severity & ~WARNING) == ERROR) {
    this->sawError = true;
    pPVar1 = this->context;
    strArray<kj::ArrayPtr<void*const>&>
              ((String *)&local_150,(kj *)&trace,(ArrayPtr<void_*const> *)0x518d3e,(char *)params_1)
    ;
    trace_00.size_ = (size_t)params_1;
    trace_00.ptr = (void **)trace.size_;
    stringifyStackTrace((String *)&local_168,(kj *)trace.ptr,trace_00);
    str<kj::String&,char_const(&)[9],kj::String,kj::String>
              ((String *)&local_188,(kj *)text,(String *)0x57b11f,(char (*) [9])&local_150,
               (String *)&local_168,params_3);
    if (local_188.size_ == 0) {
      local_188.ptr = "";
    }
    (*pPVar1->_vptr_ProcessContext[3])
              (pPVar1,local_188.ptr,local_188.size_ + (local_188.size_ == 0));
    Array<char>::~Array(&local_188);
    Array<char>::~Array(&local_168);
    Array<char>::~Array(&local_150);
  }
  else {
    sVar2 = (text->content).size_;
    if (sVar2 == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = (text->content).ptr;
    }
    (*this->context->_vptr_ProcessContext[2])(this->context,pcVar3,sVar2 + (sVar2 == 0));
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    void* traceSpace[32];
    auto trace = getStackTrace(traceSpace, 2);

    if (text.size() == 0) {
      text = kj::heapString("expectation failed");
    }

    text = kj::str(kj::repeat('_', contextDepth), file, ':', line, ": ", kj::mv(text));

    if (severity == LogSeverity::ERROR || severity == LogSeverity::FATAL) {
      sawError = true;
      context.error(kj::str(text, "\nstack: ", strArray(trace, " "), stringifyStackTrace(trace)));
    } else {
      context.warning(text);
    }
  }